

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_linux_alsa.c
# Opt level: O0

PaError PaAlsaStream_SetUpBuffers(PaAlsaStream *self,unsigned_long *numFrames,int *xrunOccurred)

{
  int *in_RDX;
  ulong *in_RSI;
  PaAlsaStream *in_RDI;
  bool bVar1;
  int xrun;
  unsigned_long commonFrames;
  unsigned_long playbackFrames;
  unsigned_long captureFrames;
  PaError result;
  ulong local_50;
  int local_44;
  ulong local_40;
  unsigned_long local_38;
  unsigned_long local_30;
  PaError local_24;
  int *local_20;
  ulong *local_18;
  PaAlsaStream *local_10;
  
  local_24 = 0;
  local_30 = 0xffffffffffffffff;
  local_38 = 0xffffffffffffffff;
  local_40 = 0;
  local_44 = 0;
  if (*in_RDX != 0) {
    *in_RSI = 0;
    return 0;
  }
  bVar1 = true;
  if ((in_RDI->capture).ready == 0) {
    bVar1 = (in_RDI->playback).ready != 0;
  }
  local_20 = in_RDX;
  local_18 = in_RSI;
  local_10 = in_RDI;
  if (bVar1) {
    if (((in_RDI->capture).pcm != (snd_pcm_t *)0x0) && ((in_RDI->capture).ready != 0)) {
      local_30 = *in_RSI;
      paUtilErr_ = PaAlsaStreamComponent_RegisterChannels
                             (&in_RDI->capture,&in_RDI->bufferProcessor,&local_30,&local_44);
      if (paUtilErr_ < 0) {
        PaUtil_DebugPrint(
                         "Expression \'PaAlsaStreamComponent_RegisterChannels( &self->capture, &self->bufferProcessor, &captureFrames, &xrun )\' failed in \'/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 4093\n"
                         );
        local_24 = paUtilErr_;
        goto LAB_0011d70d;
      }
    }
    if (((local_10->playback).pcm != (snd_pcm_t *)0x0) && ((local_10->playback).ready != 0)) {
      local_38 = *local_18;
      paUtilErr_ = PaAlsaStreamComponent_RegisterChannels
                             (&local_10->playback,&local_10->bufferProcessor,&local_38,&local_44);
      if (paUtilErr_ < 0) {
        PaUtil_DebugPrint(
                         "Expression \'PaAlsaStreamComponent_RegisterChannels( &self->playback, &self->bufferProcessor, &playbackFrames, &xrun )\' failed in \'/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 4099\n"
                         );
        local_24 = paUtilErr_;
        goto LAB_0011d70d;
      }
    }
    if (local_44 == 0) {
      if (local_30 < local_38) {
        local_50 = local_30;
      }
      else {
        local_50 = local_38;
      }
      local_40 = local_50;
      if (*local_18 < local_50) {
        local_40 = 0;
      }
      else {
        if ((local_10->capture).pcm != (snd_pcm_t *)0x0) {
          if ((local_10->capture).ready == 0) {
            PaUtil_SetNoInput(&local_10->bufferProcessor);
          }
          else {
            PaUtil_SetInputFrameCount(&local_10->bufferProcessor,local_50);
          }
        }
        if ((local_10->playback).pcm != (snd_pcm_t *)0x0) {
          if ((local_10->playback).ready == 0) {
            PaUtil_SetNoOutput(&local_10->bufferProcessor);
          }
          else {
            PaUtil_SetOutputFrameCount(&local_10->bufferProcessor,local_40);
          }
        }
      }
    }
    *local_18 = local_40;
  }
  else {
    PaUtil_DebugPrint(
                     "Expression \'self->capture.ready || self->playback.ready\' failed in \'/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 4084\n"
                     );
    local_24 = -0x2702;
  }
LAB_0011d70d:
  do {
    if (local_44 == 0) {
LAB_0011d761:
      *local_20 = local_44;
      return local_24;
    }
    paUtilErr_ = PaAlsaStream_HandleXrun(local_10);
    if (-1 < paUtilErr_) {
      *local_18 = 0;
      goto LAB_0011d761;
    }
    PaUtil_DebugPrint(
                     "Expression \'PaAlsaStream_HandleXrun( self )\' failed in \'/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 4166\n"
                     );
    local_24 = paUtilErr_;
  } while( true );
}

Assistant:

static PaError PaAlsaStream_SetUpBuffers( PaAlsaStream* self, unsigned long* numFrames, int* xrunOccurred )
{
    PaError result = paNoError;
    unsigned long captureFrames = ULONG_MAX, playbackFrames = ULONG_MAX, commonFrames = 0;
    int xrun = 0;

    if( *xrunOccurred )
    {
        *numFrames = 0;
        return result;
    }
    /* If we got here at least one of the pcm's should be marked ready */
    PA_UNLESS( self->capture.ready || self->playback.ready, paInternalError );

    /* Extract per-channel ALSA buffer pointers and register them with the buffer processor.
     * It is possible that a direction is not marked ready however, because it is out of sync with the other.
     */
    if( self->capture.pcm && self->capture.ready )
    {
        captureFrames = *numFrames;
        PA_ENSURE( PaAlsaStreamComponent_RegisterChannels( &self->capture, &self->bufferProcessor, &captureFrames,
                    &xrun ) );
    }
    if( self->playback.pcm && self->playback.ready )
    {
        playbackFrames = *numFrames;
        PA_ENSURE( PaAlsaStreamComponent_RegisterChannels( &self->playback, &self->bufferProcessor, &playbackFrames,
                    &xrun ) );
    }
    if( xrun )
    {
        /* Nothing more to do */
        assert( 0 == commonFrames );
        goto end;
    }

    commonFrames = PA_MIN( captureFrames, playbackFrames );
    /* assert( commonFrames <= *numFrames ); */
    if( commonFrames > *numFrames )
    {
        /* Hmmm ... how come there are more frames available than we requested!? Blah. */
        PA_DEBUG(( "%s: Common available frames are reported to be more than number requested: %lu, %lu, callbackMode: %d\n", __FUNCTION__,
                    commonFrames, *numFrames, self->callbackMode ));
        if( self->capture.pcm )
        {
            PA_DEBUG(( "%s: captureFrames: %lu, capture.ready: %d\n", __FUNCTION__, captureFrames, self->capture.ready ));
        }
        if( self->playback.pcm )
        {
            PA_DEBUG(( "%s: playbackFrames: %lu, playback.ready: %d\n", __FUNCTION__, playbackFrames, self->playback.ready ));
        }

        commonFrames = 0;
        goto end;
    }

    /* Inform PortAudio of the number of frames we got.
     * @concern FullDuplex We might be experiencing underflow in either end; if its an input underflow, we go on
     * with output. If its output underflow however, depending on the paNeverDropInput flag, we may want to simply
     * discard the excess input or call the callback with paOutputOverflow flagged.
     */
    if( self->capture.pcm )
    {
        if( self->capture.ready )
        {
            PaUtil_SetInputFrameCount( &self->bufferProcessor, commonFrames );
        }
        else
        {
            /* We have input underflow */
            PaUtil_SetNoInput( &self->bufferProcessor );
        }
    }
    if( self->playback.pcm )
    {
        if( self->playback.ready )
        {
            PaUtil_SetOutputFrameCount( &self->bufferProcessor, commonFrames );
        }
        else
        {
            /* We have output underflow, but keeping input data (paNeverDropInput) */
            assert( self->neverDropInput );
            assert( self->capture.pcm != NULL );
            PA_DEBUG(( "%s: Setting output buffers to NULL\n", __FUNCTION__ ));
            PaUtil_SetNoOutput( &self->bufferProcessor );
        }
    }

end:
    *numFrames = commonFrames;
error:
    if( xrun )
    {
        PA_ENSURE( PaAlsaStream_HandleXrun( self ) );
        *numFrames = 0;
    }
    *xrunOccurred = xrun;

    return result;
}